

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

void google::protobuf::internal::WireFormat::SerializeWithCachedSizes
               (Message *message,int size,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Descriptor *this;
  undefined4 extraout_var;
  MessageOptions *pMVar5;
  ulong uVar6;
  size_type sVar7;
  reference ppFVar8;
  UnknownFieldSet *pUVar9;
  LogMessage *pLVar10;
  LogFinisher local_aa;
  byte local_a9;
  LogMessage local_a8;
  int local_6c;
  FieldDescriptor *pFStack_68;
  int i_1;
  int local_60;
  int i;
  undefined1 local_50 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  int expected_endpoint;
  Reflection *message_reflection;
  Descriptor *descriptor;
  CodedOutputStream *output_local;
  int size_local;
  Message *message_local;
  long *plVar4;
  
  this = Message::GetDescriptor(message);
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  iVar2 = io::CodedOutputStream::ByteCount(output);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar2 + size;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_50);
  pMVar5 = Descriptor::options(this);
  bVar1 = MessageOptions::map_entry(pMVar5);
  if (bVar1) {
    for (local_60 = 0; iVar2 = local_60, iVar3 = Descriptor::field_count(this), iVar2 < iVar3;
        local_60 = local_60 + 1) {
      pFStack_68 = Descriptor::field(this,local_60);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_50,&stack0xffffffffffffff98);
    }
  }
  else {
    (**(code **)(*plVar4 + 0x80))(plVar4,message,local_50);
  }
  for (local_6c = 0; uVar6 = (ulong)local_6c,
      sVar7 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)local_50), uVar6 < sVar7; local_6c = local_6c + 1) {
    ppFVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)local_50,(long)local_6c);
    SerializeFieldWithCachedSizes(*ppFVar8,message,output);
  }
  pMVar5 = Descriptor::options(this);
  bVar1 = MessageOptions::message_set_wire_format(pMVar5);
  if (bVar1) {
    pUVar9 = (UnknownFieldSet *)(**(code **)(*plVar4 + 0x10))(plVar4,message);
    SerializeUnknownMessageSetItems(pUVar9,output);
  }
  else {
    pUVar9 = (UnknownFieldSet *)(**(code **)(*plVar4 + 0x10))(plVar4,message);
    SerializeUnknownFields(pUVar9,output);
  }
  local_a9 = 0;
  iVar2 = io::CodedOutputStream::ByteCount(output);
  if (iVar2 != fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
    LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x33e);
    local_a9 = 1;
    pLVar10 = LogMessage::operator<<
                        (&local_a8,"CHECK failed: (output->ByteCount()) == (expected_endpoint): ");
    pLVar10 = LogMessage::operator<<
                        (pLVar10,
                         ": Protocol message serialized to a size different from what was originally expected.  Perhaps it was modified by another thread during serialization?"
                        );
    LogFinisher::operator=(&local_aa,pLVar10);
  }
  if ((local_a9 & 1) != 0) {
    LogMessage::~LogMessage(&local_a8);
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_50);
  return;
}

Assistant:

void WireFormat::SerializeWithCachedSizes(
    const Message& message,
    int size, io::CodedOutputStream* output) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();
  int expected_endpoint = output->ByteCount() + size;

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (int i = 0; i < fields.size(); i++) {
    SerializeFieldWithCachedSizes(fields[i], message, output);
  }

  if (descriptor->options().message_set_wire_format()) {
    SerializeUnknownMessageSetItems(
        message_reflection->GetUnknownFields(message), output);
  } else {
    SerializeUnknownFields(
        message_reflection->GetUnknownFields(message), output);
  }

  GOOGLE_CHECK_EQ(output->ByteCount(), expected_endpoint)
    << ": Protocol message serialized to a size different from what was "
       "originally expected.  Perhaps it was modified by another thread "
       "during serialization?";
}